

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

MemoryRegion *
memory_map_ptr_m68k(uc_struct_conflict3 *uc,hwaddr begin,size_t size,uint32_t perms,void *ptr)

{
  MemoryRegion *ram;
  void *ptr_local;
  uint32_t perms_local;
  size_t size_local;
  hwaddr begin_local;
  uc_struct_conflict3 *uc_local;
  
  uc_local = (uc_struct_conflict3 *)g_malloc_n(1,0xa0);
  memory_region_init_ram_ptr_m68k(uc,(MemoryRegion *)uc_local,size,ptr);
  *(uint32_t *)&uc_local->reg_read_m68k = perms;
  if (((uc_local->address_space_memory).uc == (uc_struct_conflict12 *)0xffffffffffffffff) ||
     (*(RAMBlock **)&uc_local->errnum == (RAMBlock *)0x0)) {
    g_free(uc_local);
    uc_local = (uc_struct_conflict3 *)0x0;
  }
  else {
    memory_region_add_subregion_m68k(uc->system_memory,begin,(MemoryRegion *)uc_local);
    if (uc->cpu != (CPUState *)0x0) {
      tlb_flush_m68k(uc->cpu);
    }
  }
  return (MemoryRegion *)uc_local;
}

Assistant:

MemoryRegion *memory_map_ptr(struct uc_struct *uc, hwaddr begin, size_t size, uint32_t perms, void *ptr)
{
    MemoryRegion *ram = g_new(MemoryRegion, 1);

    memory_region_init_ram_ptr(uc, ram, size, ptr);
    ram->perms = perms;
    if (ram->addr == -1 || !ram->ram_block) {
        // out of memory
        g_free(ram);
        return NULL;
    }

    memory_region_add_subregion(uc->system_memory, begin, ram);

    if (uc->cpu) {
        tlb_flush(uc->cpu);
    }

    return ram;
}